

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int moveto_snode_check(lys_node *node,lyxp_node_type root_type,char *node_name,
                      lys_module *moveto_mod,int options)

{
  LYS_NODE LVar1;
  lys_node *node_00;
  lys_module *plVar2;
  int iVar3;
  
  node_00 = lys_parent(node);
  iVar3 = -1;
  do {
    if (node_00 == (lys_node *)0x0) {
LAB_0016812a:
      if ((((moveto_mod == (lys_module *)0x0) ||
           (plVar2 = lys_node_module(node), plVar2 == moveto_mod)) &&
          ((root_type != LYXP_NODE_ROOT_CONFIG || ((node->flags & 2) == 0)))) &&
         ((node->name == node_name || ((*node_name == '*' && (node_name[1] == '\0')))))) {
        iVar3 = 0;
      }
      return iVar3;
    }
    LVar1 = node_00->nodetype;
    if (LVar1 != LYS_USES) {
      if ((options & 0x20U) == 0) {
        if (LVar1 == LYS_OUTPUT) {
          return -1;
        }
      }
      else if (LVar1 == LYS_INPUT) {
        return -1;
      }
      goto LAB_0016812a;
    }
    node_00 = lys_parent(node_00);
  } while( true );
}

Assistant:

static int
moveto_snode_check(const struct lys_node *node, enum lyxp_node_type root_type, const char *node_name,
                   struct lys_module *moveto_mod, int options)
{
    struct lys_node *parent;

    /* RPC input/output check */
    for (parent = lys_parent(node); parent && (parent->nodetype == LYS_USES); parent = lys_parent(parent));
    if (options & LYXP_SNODE_OUTPUT) {
        if (parent && (parent->nodetype == LYS_INPUT)) {
            return -1;
        }
    } else {
        if (parent && (parent->nodetype == LYS_OUTPUT)) {
            return -1;
        }
    }

    /* module check */
    if (moveto_mod && (lys_node_module(node) != moveto_mod)) {
        return -1;
    }

    /* context check */
    if ((root_type == LYXP_NODE_ROOT_CONFIG) && (node->flags & LYS_CONFIG_R)) {
        return -1;
    }

    /* name check */
    if (!ly_strequal(node->name, node_name, 1) && strcmp(node_name, "*")) {
        return -1;
    }

    /* match */
    return EXIT_SUCCESS;
}